

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
           *this,DefinitionSymbol **p,ulong hash,arrays_type *arrays_,long *num_destroyed)

{
  pair<const_slang::ast::DefinitionSymbol_*&&,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_&&>
  local_38;
  locator local_28;
  
  *num_destroyed = *num_destroyed + 1;
  local_38.first = p;
  local_38.second =
       (vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *)(p + 1);
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::DefinitionSymbol_const*,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>>>
  ::
  nosize_unchecked_emplace_at<std::pair<slang::ast::DefinitionSymbol_const*&&,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>&&>>
            (&local_28,
             (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::DefinitionSymbol_const*,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>>>
              *)this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,&local_38);
  std::_Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                 *)(p + 1));
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }